

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBSTest_ASN1Int64_Test::TestBody(CBSTest_ASN1Int64_Test *this)

{
  allocator<unsigned_char> *this_00;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cbb_st *pcVar5;
  reference pvVar6;
  bool *lhs;
  char *in_R9;
  AssertHelper local_908;
  Message local_900;
  Bytes local_8f8;
  Bytes local_8e8;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_11;
  UniquePtr<uint8_t> scoper_2;
  AssertHelper local_8a0;
  Message local_898;
  int local_88c;
  undefined1 local_888 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_858;
  Message local_850;
  int local_844;
  undefined1 local_840 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_810;
  Message local_808;
  int local_7fc;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__13;
  ScopedCBB cbb_2;
  Message local_7b0;
  bool local_7a2;
  bool local_7a1;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_10;
  Message local_788;
  bool local_77a;
  bool local_779;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_748;
  Message local_740;
  int local_734;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_700;
  Message local_6f8;
  int local_6ec;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__11;
  undefined1 local_6d0 [4];
  int is_negative_1;
  CBS child_2;
  Message local_6b8;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_8;
  Message local_698;
  size_t local_690;
  uint local_684;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_650;
  Message local_648;
  int local_63c;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__10;
  size_t len_1;
  uint8_t *out_1;
  int64_t value_2;
  CBS cbs_2;
  undefined1 local_5f8 [7];
  ScopedTrace gtest_trace_1152;
  ScopedTrace local_5e1;
  ASN1Int64WithTagTest *pAStack_5e0;
  ScopedTrace gtest_trace_1151;
  ASN1Int64WithTagTest *test_2;
  ASN1Int64WithTagTest *__end1_2;
  ASN1Int64WithTagTest *__begin1_2;
  ASN1Int64WithTagTest (*__range1_2) [5];
  Message local_5b8;
  bool local_5a9;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_6;
  CBS child_1;
  AssertHelper local_568;
  Message local_560;
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__9;
  int64_t value_1;
  CBS cbs_1;
  ScopedTrace local_511;
  ASN1InvalidInt64Test *pAStack_510;
  ScopedTrace gtest_trace_1136;
  ASN1InvalidInt64Test *test_1;
  ASN1InvalidInt64Test *__end1_1;
  ASN1InvalidInt64Test *__begin1_1;
  ASN1InvalidInt64Test (*__range1_1) [6];
  Message local_4e8;
  Bytes local_4e0;
  Span<const_unsigned_char> local_4d0;
  Bytes local_4c0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_498 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  UniquePtr<uint8_t> scoper_1;
  AssertHelper local_458;
  Message local_450;
  int local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_410;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_3c8;
  Message local_3c0;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__6;
  ScopedCBB cbb_1;
  Message local_368;
  Bytes local_360;
  Bytes local_350;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_4;
  UniquePtr<uint8_t> scoper;
  AssertHelper local_308;
  Message local_300;
  int local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2c0;
  Message local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_278;
  Message local_270;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__3;
  ScopedCBB cbb;
  Message local_218;
  bool local_20a;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_3;
  Message local_1f0;
  bool local_1e2;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1b0;
  Message local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_168;
  Message local_160;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_138 [4];
  int is_negative;
  CBS child;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  Message local_100;
  size_t local_f8;
  uint local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  size_t len;
  uint8_t *out;
  int64_t value;
  CBS cbs;
  ScopedTrace local_49;
  undefined1 local_48 [7];
  ScopedTrace gtest_trace_1092;
  ScopedTrace local_31;
  ASN1Int64Test *pAStack_30;
  ScopedTrace gtest_trace_1091;
  ASN1Int64Test *test;
  ASN1Int64Test *__end1;
  ASN1Int64Test *__begin1;
  ASN1Int64Test (*__range1) [13];
  CBSTest_ASN1Int64_Test *this_local;
  
  __end1 = (ASN1Int64Test *)&(anonymous_namespace)::kASN1Int64Tests;
  while( true ) {
    if (__end1 == (ASN1Int64Test *)&DAT_00a98308) {
      for (__end1_1 = (ASN1InvalidInt64Test *)&(anonymous_namespace)::kASN1InvalidInt64Tests;
          __end1_1 != (ASN1InvalidInt64Test *)&(anonymous_namespace)::kASN1Int64WithTagTests;
          __end1_1 = __end1_1 + 1) {
        pAStack_510 = __end1_1;
        Bytes::Bytes((Bytes *)&cbs_1.len,__end1_1->encoding,__end1_1->encoding_len);
        testing::ScopedTrace::ScopedTrace<Bytes>
                  (&local_511,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x470,(Bytes *)&cbs_1.len);
        CBS_init((CBS *)&value_1,(uint8_t *)pAStack_510->encoding,pAStack_510->encoding_len);
        iVar3 = CBS_get_asn1_int64((CBS *)&value_1,(int64_t *)&gtest_ar__9.message_);
        local_551 = iVar3 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_550,&local_551,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
        if (!bVar2) {
          testing::Message::Message(&local_560);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&child_1.len,(internal *)local_550,
                     (AssertionResult *)"CBS_get_asn1_int64(&cbs, &value)","true","false",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_568,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x475,pcVar4);
          testing::internal::AssertHelper::operator=(&local_568,&local_560);
          testing::internal::AssertHelper::~AssertHelper(&local_568);
          std::__cxx11::string::~string((string *)&child_1.len);
          testing::Message::~Message(&local_560);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
        CBS_init((CBS *)&value_1,(uint8_t *)pAStack_510->encoding,pAStack_510->encoding_len);
        iVar3 = CBS_get_asn1((CBS *)&value_1,(CBS *)&gtest_ar_6.message_,2);
        if (iVar3 != 0) {
          lhs = &pAStack_510->overflow;
          iVar3 = CBS_is_valid_asn1_integer((CBS *)&gtest_ar_6.message_,(int *)0x0);
          local_5a9 = iVar3 != 0;
          testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                    ((EqHelper *)local_5a8,"test.overflow",
                     "!!CBS_is_valid_asn1_integer(&child, __null)",lhs,&local_5a9);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
          if (!bVar2) {
            testing::Message::Message(&local_5b8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&__range1_2,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x47a,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_2,&local_5b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_2);
            testing::Message::~Message(&local_5b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
        }
        testing::ScopedTrace::~ScopedTrace(&local_511);
      }
      __end1_2 = (ASN1Int64WithTagTest *)&(anonymous_namespace)::kASN1Int64WithTagTests;
      while( true ) {
        if (__end1_2 ==
            (ASN1Int64WithTagTest *)
            &testing::internal::TestFactoryImpl<(anonymous_namespace)::CBBTest_Zero_Test>::vtable) {
          return;
        }
        pAStack_5e0 = __end1_2;
        Bytes::Bytes((Bytes *)local_5f8,__end1_2->encoding,__end1_2->encoding_len);
        testing::ScopedTrace::ScopedTrace<Bytes>
                  (&local_5e1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x47f,(Bytes *)local_5f8);
        testing::ScopedTrace::ScopedTrace<long>
                  ((ScopedTrace *)((long)&cbs_2.len + 7),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x480,&pAStack_5e0->value);
        CBS_init((CBS *)&value_2,(uint8_t *)pAStack_5e0->encoding,pAStack_5e0->encoding_len);
        local_63c = CBS_get_asn1_int64_with_tag((CBS *)&value_2,(int64_t *)&out_1,pAStack_5e0->tag);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_638,&local_63c,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
        if (!bVar2) {
          testing::Message::Message(&local_648);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_7.message_,(internal *)local_638,
                     (AssertionResult *)"CBS_get_asn1_int64_with_tag(&cbs, &value, test.tag)",
                     "false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_650,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x487,pcVar4);
          testing::internal::AssertHelper::operator=(&local_650,&local_648);
          testing::internal::AssertHelper::~AssertHelper(&local_650);
          std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_648);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_684 = 0;
          local_690 = CBS_len((CBS *)&value_2);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_680,"0u","CBS_len(&cbs)",&local_684,&local_690);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
          if (!bVar2) {
            testing::Message::Message(&local_698);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x488,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_698);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_698);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
          testing::internal::EqHelper::Compare<long,_long,_nullptr>
                    ((EqHelper *)local_6b0,"test.value","value",&pAStack_5e0->value,(long *)&out_1);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
          if (!bVar2) {
            testing::Message::Message(&local_6b8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&child_2.len,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x489,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&child_2.len,&local_6b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&child_2.len);
            testing::Message::~Message(&local_6b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
          CBS_init((CBS *)&value_2,(uint8_t *)pAStack_5e0->encoding,pAStack_5e0->encoding_len);
          local_6ec = CBS_get_asn1((CBS *)&value_2,(CBS *)local_6d0,pAStack_5e0->tag);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_6e8,&local_6ec,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
          if (!bVar2) {
            testing::Message::Message(&local_6f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__12.message_,(internal *)local_6e8,
                       (AssertionResult *)"CBS_get_asn1(&cbs, &child, test.tag)","false","true",
                       in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_700,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x48e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
            testing::internal::AssertHelper::~AssertHelper(&local_700);
            std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
            testing::Message::~Message(&local_6f8);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_734 = CBS_is_valid_asn1_integer
                                  ((CBS *)local_6d0,
                                   (int *)((long)&gtest_ar__11.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          + 4));
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_730,&local_734,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
            if (!bVar2) {
              testing::Message::Message(&local_740);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_9.message_,(internal *)local_730,
                         (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)",
                         "false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_748,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x48f,pcVar4);
              testing::internal::AssertHelper::operator=(&local_748,&local_740);
              testing::internal::AssertHelper::~AssertHelper(&local_748);
              std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_740);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
            local_779 = SUB81((ulong)pAStack_5e0->value >> 0x3f,0);
            local_77a = gtest_ar__11.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ != 0;
            testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                      ((EqHelper *)local_778,"test.value < 0","!!is_negative",&local_779,&local_77a)
            ;
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
            if (!bVar2) {
              testing::Message::Message(&local_788);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x490,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_10.message_,&local_788);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
              testing::Message::~Message(&local_788);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
            local_7a1 = -1 < pAStack_5e0->value;
            iVar3 = CBS_is_unsigned_asn1_integer((CBS *)local_6d0);
            local_7a2 = iVar3 != 0;
            testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                      ((EqHelper *)local_7a0,"test.value >= 0",
                       "!!CBS_is_unsigned_asn1_integer(&child)",&local_7a1,&local_7a2);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
            if (!bVar2) {
              testing::Message::Message(&local_7b0);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)((long)&cbb_2.ctx_.u + 0x18),kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x491,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)((long)&cbb_2.ctx_.u + 0x18),&local_7b0);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)((long)&cbb_2.ctx_.u + 0x18));
              testing::Message::~Message(&local_7b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
            bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                       &gtest_ar__13.message_);
            pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                &gtest_ar__13.message_);
            local_7fc = CBB_init(pcVar5,0);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_7f8,&local_7fc,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
            if (!bVar2) {
              testing::Message::Message(&local_808);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__14.message_,(internal *)local_7f8,
                         (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_810,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x495,pcVar4);
              testing::internal::AssertHelper::operator=(&local_810,&local_808);
              testing::internal::AssertHelper::~AssertHelper(&local_810);
              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
              testing::Message::~Message(&local_808);
            }
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &gtest_ar__13.message_);
              local_844 = CBB_add_asn1_int64_with_tag(pcVar5,pAStack_5e0->value,pAStack_5e0->tag);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_840,&local_844,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
              if (!bVar2) {
                testing::Message::Message(&local_850);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__15.message_,(internal *)local_840,
                           (AssertionResult *)
                           "CBB_add_asn1_int64_with_tag(cbb.get(), test.value, test.tag)","false",
                           "true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_858,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x496,pcVar4);
                testing::internal::AssertHelper::operator=(&local_858,&local_850);
                testing::internal::AssertHelper::~AssertHelper(&local_858);
                std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                testing::Message::~Message(&local_850);
              }
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
              if (gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    &gtest_ar__13.message_);
                local_88c = CBB_finish(pcVar5,(uint8_t **)&len_1,(size_t *)&gtest_ar__10.message_);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_888,&local_88c,(type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_888);
                if (!bVar2) {
                  testing::Message::Message(&local_898);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&scoper_2,(internal *)local_888,
                             (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_8a0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x497,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_8a0,&local_898);
                  testing::internal::AssertHelper::~AssertHelper(&local_8a0);
                  std::__cxx11::string::~string((string *)&scoper_2);
                  testing::Message::~Message(&local_898);
                }
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
                if (gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                             &gtest_ar_11.message_,(pointer)len_1);
                  Bytes::Bytes(&local_8e8,pAStack_5e0->encoding,pAStack_5e0->encoding_len);
                  Bytes::Bytes(&local_8f8,(uint8_t *)len_1,
                               (size_t)gtest_ar__10.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
                  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                            ((EqHelper *)local_8d8,"Bytes(test.encoding, test.encoding_len)",
                             "Bytes(out, len)",&local_8e8,&local_8f8);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_8d8);
                  if (!bVar2) {
                    testing::Message::Message(&local_900);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_908,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                               ,0x499,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_908,&local_900);
                    testing::internal::AssertHelper::~AssertHelper(&local_908);
                    testing::Message::~Message(&local_900);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
                  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                             &gtest_ar_11.message_);
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ = 0;
                }
              }
            }
            bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                       &gtest_ar__13.message_);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = 0;
            }
          }
        }
        testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&cbs_2.len + 7));
        testing::ScopedTrace::~ScopedTrace(&local_5e1);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) break;
        __end1_2 = __end1_2 + 1;
      }
      return;
    }
    pAStack_30 = __end1;
    Bytes::Bytes((Bytes *)local_48,__end1->encoding,__end1->encoding_len);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_31,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x443,(Bytes *)local_48);
    testing::ScopedTrace::ScopedTrace<long>
              (&local_49,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x444,&pAStack_30->value);
    CBS_init((CBS *)&value,(uint8_t *)pAStack_30->encoding,pAStack_30->encoding_len);
    local_9c = CBS_get_asn1_int64((CBS *)&value,(int64_t *)&out);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_98,&local_9c,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar2) {
      testing::Message::Message(&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_d0,(internal *)local_98,
                 (AssertionResult *)"CBS_get_asn1_int64(&cbs, &value)","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,1099,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      testing::Message::~Message(&local_a8);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_ec = 0;
      local_f8 = CBS_len((CBS *)&value);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_e8,"0u","CBS_len(&cbs)",&local_ec,&local_f8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
      if (!bVar2) {
        testing::Message::Message(&local_100);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x44c,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                ((EqHelper *)local_118,"test.value","value",&pAStack_30->value,(long *)&out);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar2) {
        testing::Message::Message(&local_120);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&child.len,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x44d,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&child.len,&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&child.len);
        testing::Message::~Message(&local_120);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      CBS_init((CBS *)&value,(uint8_t *)pAStack_30->encoding,pAStack_30->encoding_len);
      local_154 = CBS_get_asn1((CBS *)&value,(CBS *)local_138,2);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_150,&local_154,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
      if (!bVar2) {
        testing::Message::Message(&local_160);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_150,
                   (AssertionResult *)"CBS_get_asn1(&cbs, &child, 0x2u)","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x452,pcVar4);
        testing::internal::AssertHelper::operator=(&local_168,&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_160);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_19c = CBS_is_valid_asn1_integer
                              ((CBS *)local_138,
                               (int *)((long)&gtest_ar__1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      + 4));
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_198,&local_19c,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
        if (!bVar2) {
          testing::Message::Message(&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_198,
                     (AssertionResult *)"CBS_is_valid_asn1_integer(&child, &is_negative)","false",
                     "true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x453,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
          testing::internal::AssertHelper::~AssertHelper(&local_1b0);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_1a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
        local_1e1 = SUB81((ulong)pAStack_30->value >> 0x3f,0);
        local_1e2 = gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ != 0;
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  ((EqHelper *)local_1e0,"test.value < 0","!!is_negative",&local_1e1,&local_1e2);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
        if (!bVar2) {
          testing::Message::Message(&local_1f0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x454,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_1f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_1f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
        local_209 = -1 < pAStack_30->value;
        iVar3 = CBS_is_unsigned_asn1_integer((CBS *)local_138);
        local_20a = iVar3 != 0;
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  ((EqHelper *)local_208,"test.value >= 0","!!CBS_is_unsigned_asn1_integer(&child)",
                   &local_209,&local_20a);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
        if (!bVar2) {
          testing::Message::Message(&local_218);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&cbb.ctx_.u + 0x18),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x455,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)((long)&cbb.ctx_.u + 0x18),&local_218);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&cbb.ctx_.u + 0x18))
          ;
          testing::Message::~Message(&local_218);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__3.message_);
        pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            &gtest_ar__3.message_);
        local_264 = CBB_init(pcVar5,0);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_260,&local_264,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
        if (!bVar2) {
          testing::Message::Message(&local_270);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_260,
                     (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_278,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x459,pcVar4);
          testing::internal::AssertHelper::operator=(&local_278,&local_270);
          testing::internal::AssertHelper::~AssertHelper(&local_278);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_270);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              &gtest_ar__3.message_);
          local_2ac = CBB_add_asn1_int64(pcVar5,pAStack_30->value);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_2a8,&local_2ac,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
          if (!bVar2) {
            testing::Message::Message(&local_2b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_2a8,
                       (AssertionResult *)"CBB_add_asn1_int64(cbb.get(), test.value)","false","true"
                       ,in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x45a,pcVar4);
            testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
            testing::internal::AssertHelper::~AssertHelper(&local_2c0);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_2b8);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                &gtest_ar__3.message_);
            local_2f4 = CBB_finish(pcVar5,(uint8_t **)&len,(size_t *)&gtest_ar_.message_);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2f0,&local_2f4,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
            if (!bVar2) {
              testing::Message::Message(&local_300);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&scoper,(internal *)local_2f0,
                         (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",in_R9
                        );
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_308,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x45b,pcVar4);
              testing::internal::AssertHelper::operator=(&local_308,&local_300);
              testing::internal::AssertHelper::~AssertHelper(&local_308);
              std::__cxx11::string::~string((string *)&scoper);
              testing::Message::~Message(&local_300);
            }
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar_4.message_,
                         (pointer)len);
              Bytes::Bytes(&local_350,pAStack_30->encoding,pAStack_30->encoding_len);
              Bytes::Bytes(&local_360,(uint8_t *)len,
                           (size_t)gtest_ar_.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
              testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                        ((EqHelper *)local_340,"Bytes(test.encoding, test.encoding_len)",
                         "Bytes(out, len)",&local_350,&local_360);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
              if (!bVar2) {
                testing::Message::Message(&local_368);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)((long)&cbb_1.ctx_.u + 0x18),kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x45d,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)((long)&cbb_1.ctx_.u + 0x18),&local_368);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)((long)&cbb_1.ctx_.u + 0x18));
                testing::Message::~Message(&local_368);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar_4.message_)
              ;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = 0;
            }
          }
        }
        bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__3.message_);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__6.message_)
          ;
          pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              &gtest_ar__6.message_);
          local_3b4 = CBB_init(pcVar5,0);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_3b0,&local_3b4,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
          if (!bVar2) {
            testing::Message::Message(&local_3c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_3b0,
                       (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x463,pcVar4);
            testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
            testing::internal::AssertHelper::~AssertHelper(&local_3c8);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_3c0);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                &gtest_ar__6.message_);
            local_3fc = CBB_add_asn1_int64_with_tag(pcVar5,pAStack_30->value,0x80000001);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_3f8,&local_3fc,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
            if (!bVar2) {
              testing::Message::Message(&local_408);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__8.message_,(internal *)local_3f8,
                         (AssertionResult *)
                         "CBB_add_asn1_int64_with_tag(cbb.get(), test.value, (0x80u << 24) | 1)",
                         "false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_410,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x465,pcVar4);
              testing::internal::AssertHelper::operator=(&local_410,&local_408);
              testing::internal::AssertHelper::~AssertHelper(&local_410);
              std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_408);
            }
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
            if (gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &gtest_ar__6.message_);
              local_444 = CBB_finish(pcVar5,(uint8_t **)&len,(size_t *)&gtest_ar_.message_);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_440,&local_444,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
              if (!bVar2) {
                testing::Message::Message(&local_450);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&scoper_1,(internal *)local_440,
                           (AssertionResult *)"CBB_finish(cbb.get(), &out, &len)","false","true",
                           in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_458,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x466,pcVar4);
                testing::internal::AssertHelper::operator=(&local_458,&local_450);
                testing::internal::AssertHelper::~AssertHelper(&local_458);
                std::__cxx11::string::~string((string *)&scoper_1);
                testing::Message::~Message(&local_450);
              }
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
              if (gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                           &expected.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(pointer)len);
                pcVar4 = pAStack_30->encoding;
                sVar1 = pAStack_30->encoding_len;
                this_00 = (allocator<unsigned_char> *)
                          ((long)&gtest_ar_5.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 7);
                std::allocator<unsigned_char>::allocator(this_00);
                std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_498,pcVar4,
                           pcVar4 + sVar1,this_00);
                std::allocator<unsigned_char>::~allocator
                          ((allocator<unsigned_char> *)
                           ((long)&gtest_ar_5.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7));
                pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_498,0);
                *pvVar6 = 0x81;
                bssl::Span<unsigned_char_const>::
                Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((Span<unsigned_char_const> *)&local_4d0,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_498);
                Bytes::Bytes(&local_4c0,local_4d0);
                Bytes::Bytes(&local_4e0,(uint8_t *)len,
                             (size_t)gtest_ar_.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                          ((EqHelper *)local_4b0,"Bytes(expected)","Bytes(out, len)",&local_4c0,
                           &local_4e0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4b0);
                if (!bVar2) {
                  testing::Message::Message(&local_4e8);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&__range1_1,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x46b,pcVar4);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_1,&local_4e8)
                  ;
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_1);
                  testing::Message::~Message(&local_4e8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_498);
                std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                           &expected.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ = 0;
              }
            }
          }
          bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__6.message_)
          ;
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
    testing::ScopedTrace::~ScopedTrace(&local_49);
    testing::ScopedTrace::~ScopedTrace(&local_31);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST(CBSTest, ASN1Int64) {
  for (const ASN1Int64Test &test : kASN1Int64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    int64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_int64(&cbs, &value));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(test.value < 0, !!is_negative);
    EXPECT_EQ(test.value >= 0, !!CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64(cbb.get(), test.value));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }

    {
      // Overwrite the tag.
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64_with_tag(cbb.get(), test.value,
                                              CBS_ASN1_CONTEXT_SPECIFIC | 1));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      std::vector<uint8_t> expected(test.encoding,
                                    test.encoding + test.encoding_len);
      expected[0] = 0x81;
      EXPECT_EQ(Bytes(expected), Bytes(out, len));
    }
  }

  for (const ASN1InvalidInt64Test &test : kASN1InvalidInt64Tests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    CBS cbs;
    int64_t value;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    EXPECT_FALSE(CBS_get_asn1_int64(&cbs, &value));

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    CBS child;
    if (CBS_get_asn1(&cbs, &child, CBS_ASN1_INTEGER)) {
      EXPECT_EQ(test.overflow, !!CBS_is_valid_asn1_integer(&child, NULL));
    }
  }

  for (const ASN1Int64WithTagTest &test : kASN1Int64WithTagTests) {
    SCOPED_TRACE(Bytes(test.encoding, test.encoding_len));
    SCOPED_TRACE(test.value);
    CBS cbs;
    int64_t value;
    uint8_t *out;
    size_t len;

    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1_int64_with_tag(&cbs, &value, test.tag));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_EQ(test.value, value);

    CBS child;
    int is_negative;
    CBS_init(&cbs, (const uint8_t *)test.encoding, test.encoding_len);
    ASSERT_TRUE(CBS_get_asn1(&cbs, &child, test.tag));
    EXPECT_TRUE(CBS_is_valid_asn1_integer(&child, &is_negative));
    EXPECT_EQ(test.value < 0, !!is_negative);
    EXPECT_EQ(test.value >= 0, !!CBS_is_unsigned_asn1_integer(&child));

    {
      bssl::ScopedCBB cbb;
      ASSERT_TRUE(CBB_init(cbb.get(), 0));
      ASSERT_TRUE(CBB_add_asn1_int64_with_tag(cbb.get(), test.value, test.tag));
      ASSERT_TRUE(CBB_finish(cbb.get(), &out, &len));
      bssl::UniquePtr<uint8_t> scoper(out);
      EXPECT_EQ(Bytes(test.encoding, test.encoding_len), Bytes(out, len));
    }
  }
}